

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O0

MatchInstr * __thiscall
flow::IRBuilder::insert<flow::MatchInstr,flow::MatchClass&,flow::Value*&>
          (IRBuilder *this,MatchClass *args,Value **args_1)

{
  MatchInstr *pMVar1;
  unique_ptr<flow::MatchInstr,_std::default_delete<flow::MatchInstr>_> local_30;
  unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_> local_28;
  Value **local_20;
  Value **args_local_1;
  MatchClass *args_local;
  IRBuilder *this_local;
  
  local_20 = args_1;
  args_local_1 = (Value **)args;
  args_local = (MatchClass *)this;
  std::make_unique<flow::MatchInstr,flow::MatchClass,flow::Value*>
            ((MatchClass *)&local_30,(Value **)args);
  std::unique_ptr<flow::Instr,std::default_delete<flow::Instr>>::
  unique_ptr<flow::MatchInstr,std::default_delete<flow::MatchInstr>,void>
            ((unique_ptr<flow::Instr,std::default_delete<flow::Instr>> *)&local_28,&local_30);
  pMVar1 = (MatchInstr *)insert(this,&local_28);
  std::unique_ptr<flow::Instr,_std::default_delete<flow::Instr>_>::~unique_ptr(&local_28);
  std::unique_ptr<flow::MatchInstr,_std::default_delete<flow::MatchInstr>_>::~unique_ptr(&local_30);
  return pMVar1;
}

Assistant:

T* insert(Args&&... args) {
    return static_cast<T*>(insert(std::make_unique<T>(std::move(args)...)));
  }